

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O3

int read_asn1_length(uchar *data,size_t datalen,size_t *len)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  
  iVar2 = -1;
  if (datalen != 0) {
    bVar5 = *data;
    uVar3 = (ulong)bVar5;
    *len = uVar3;
    uVar4 = 1;
    if ((char)bVar5 < '\0') {
      bVar5 = bVar5 & 0x7f;
      bVar1 = data[1];
      uVar3 = (ulong)bVar1;
      *len = uVar3;
      uVar4 = (ulong)(bVar5 + 1);
      if (datalen < (byte)(bVar5 + 1)) {
        return -1;
      }
      if (1 < bVar5) {
        *len = (ulong)bVar1 << 8;
        uVar3 = (ulong)CONCAT11(bVar1,data[2]);
        *len = uVar3;
        if (bVar5 != 2) {
          return -1;
        }
      }
    }
    iVar2 = -1;
    if (uVar4 + uVar3 <= datalen) {
      iVar2 = (int)uVar4;
    }
  }
  return iVar2;
}

Assistant:

static int
read_asn1_length(const unsigned char *data,
                 size_t datalen, size_t *len)
{
    unsigned int lenlen;
    int nextpos;

    if(datalen < 1) {
        return -1;
    }
    *len = data[0];

    if(*len >= 0x80) {
        lenlen = *len & 0x7F;
        *len = data[1];
        if(1 + lenlen > datalen) {
            return -1;
        }
        if(lenlen > 1) {
            *len <<= 8;
            *len |= data[2];
        }
    }
    else {
        lenlen = 0;
    }

    nextpos = 1 + lenlen;
    if(lenlen > 2 || 1 + lenlen + *len > datalen) {
        return -1;
    }

    return nextpos;
}